

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O2

void __thiscall
TasGrid::GridLocalPolynomial::evaluateBatch(GridLocalPolynomial *this,double *x,int num_x,double *y)

{
  int *piVar1;
  double dVar2;
  TypeAcceleration TVar3;
  int iVar4;
  AlgorithmPreference AVar5;
  uint uVar6;
  int iVar7;
  AccelerationContext *this_00;
  size_t sVar8;
  pointer pdVar9;
  ulong uVar10;
  int k;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  GpuVector<double> gpu_result;
  vector<double,_std::allocator<double>_> svals;
  vector<int,_std::allocator<int>_> spntr;
  GpuVector<double> gpu_x;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  this_00 = (this->super_BaseCanonicalGrid).acceleration;
  TVar3 = this_00->mode;
  if (TVar3 - accel_gpu_cuda < 2) {
    AccelerationContext::setDevice(this_00);
    if ((this->order != -1) && (num_x != 1 && this->order < 3)) {
      GpuVector<double>::GpuVector
                (&gpu_x,(this->super_BaseCanonicalGrid).acceleration,
                 (this->super_BaseCanonicalGrid).num_dimensions,num_x,x);
      GpuVector<double>::GpuVector
                (&gpu_result,(this->super_BaseCanonicalGrid).acceleration,num_x,
                 (this->super_BaseCanonicalGrid).num_outputs);
      (*(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid[0x14])
                (this,gpu_x.gpu_data,(ulong)(uint)num_x,gpu_result.gpu_data);
      GpuVector<double>::unload(&gpu_result,(this->super_BaseCanonicalGrid).acceleration,y);
      GpuVector<double>::~GpuVector(&gpu_result);
      GpuVector<double>::~GpuVector(&gpu_x);
      return;
    }
LAB_0018a20a:
    evaluateGpuMixed(this,x,num_x,y);
    return;
  }
  if (TVar3 == accel_cpu_blas) {
    if ((this_00->algorithm_select != algorithm_sparse) &&
       ((this_00->algorithm_select != algorithm_autoselect ||
        (0x400 < (this->super_BaseCanonicalGrid).num_outputs)))) {
      gpu_result.num_entries = 0;
      gpu_result.gpu_data = (double *)0x0;
      spntr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      spntr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
           = (pointer)0x0;
      spntr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      svals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      svals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      svals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      buildSpareBasisMatrix
                (this,x,num_x,0x20,&spntr,(vector<int,_std::allocator<int>_> *)&gpu_result,&svals);
      iVar4 = (this->super_BaseCanonicalGrid).points.cache_num_indexes;
      AVar5 = ((this->super_BaseCanonicalGrid).acceleration)->algorithm_select;
      if ((AVar5 == algorithm_dense) ||
         ((AVar5 == algorithm_autoselect &&
          (0.1 < (double)spntr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[num_x] / ((double)iVar4 * (double)num_x)))
         )) {
        Data2D<double>::Data2D<int,int>((Data2D<double> *)&gpu_x,iVar4,num_x,0.0);
        uVar12 = 0;
        uVar13 = (ulong)(uint)num_x;
        if (num_x < 1) {
          uVar13 = uVar12;
        }
        while (uVar12 != uVar13) {
          lVar14 = gpu_x.num_entries * uVar12;
          piVar1 = spntr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar12;
          iVar4 = spntr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar12 + 1];
          uVar12 = uVar12 + 1;
          for (lVar15 = (long)*piVar1; lVar15 < iVar4; lVar15 = lVar15 + 1) {
            local_48._M_impl.super__Vector_impl_data._M_start
            [lVar14 + *(int *)(gpu_result.num_entries + lVar15 * 4)] =
                 svals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar15];
          }
        }
        ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
      }
      else {
        uVar6 = (this->super_BaseCanonicalGrid).num_outputs;
        uVar13 = 0;
        uVar12 = 0;
        if (0 < (int)uVar6) {
          uVar12 = (ulong)uVar6;
        }
        uVar10 = (ulong)(uint)num_x;
        if (num_x < 1) {
          uVar10 = uVar13;
        }
        while (uVar13 != uVar10) {
          for (lVar14 = 0; (long)(int)uVar6 * 8 != lVar14; lVar14 = lVar14 + 8) {
            *(undefined8 *)((long)y + lVar14) = 0;
          }
          piVar1 = spntr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar13;
          iVar4 = spntr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar13 + 1];
          uVar13 = uVar13 + 1;
          sVar8 = (this->surpluses).stride;
          pdVar9 = (this->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start;
          for (lVar14 = (long)*piVar1; lVar14 < iVar4; lVar14 = lVar14 + 1) {
            dVar2 = svals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar14];
            iVar7 = *(int *)(gpu_result.num_entries + lVar14 * 4);
            for (uVar11 = 0; uVar12 != uVar11; uVar11 = uVar11 + 1) {
              y[uVar11] = pdVar9[(long)iVar7 * sVar8 + uVar11] * dVar2 + y[uVar11];
            }
          }
          y = y + (int)uVar6;
        }
      }
      ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&svals);
      ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&spntr);
      ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&gpu_result);
      return;
    }
  }
  else if (TVar3 == accel_gpu_cublas) {
    AccelerationContext::setDevice(this_00);
    goto LAB_0018a20a;
  }
  evaluateBatchOpenMP(this,x,num_x,y);
  return;
}

Assistant:

void GridLocalPolynomial::evaluateBatch(const double x[], int num_x, double y[]) const{
    switch(acceleration->mode){
        case accel_gpu_magma:
        case accel_gpu_cuda: {
            acceleration->setDevice();
            if ((order == -1) || (order > 2) || (num_x == 1)){
                // GPU evaluations are available only for order 0, 1, and 2. Cubic will come later, but higher order will not be supported.
                // cannot use GPU to accelerate the evaluation of a single vector
                evaluateGpuMixed(x, num_x, y);
                return;
            }
            GpuVector<double> gpu_x(acceleration, num_dimensions, num_x, x), gpu_result(acceleration, num_x, num_outputs);
            evaluateBatchGPU(gpu_x.data(), num_x, gpu_result.data());
            gpu_result.unload(acceleration, y);
            break;
        }
        case accel_gpu_cublas: {
            acceleration->setDevice();
            evaluateGpuMixed(x, num_x, y);
            break;
        }
        case accel_cpu_blas: {
            if (acceleration->algorithm_select == AccelerationContext::algorithm_sparse or
                (acceleration->algorithm_select == AccelerationContext::algorithm_autoselect and num_outputs <= 1024)){
                evaluateBatchOpenMP(x, num_x, y);
                return;
            }

            std::vector<int> sindx, spntr;
            std::vector<double> svals;
            buildSpareBasisMatrix(x, num_x, 32, spntr, sindx, svals); // build sparse matrix corresponding to x

            int num_points = points.getNumIndexes();
            double nnz = (double) spntr[num_x];
            double total_size = ((double) num_x) * ((double) num_points);

            if ((acceleration->algorithm_select == AccelerationContext::algorithm_dense)
                or ((acceleration->algorithm_select == AccelerationContext::algorithm_autoselect) and (nnz / total_size > 0.1))){
                // potentially wastes a lot of memory
                Data2D<double> A(num_points, num_x, 0.0);
                for(int i=0; i<num_x; i++){
                    double *row = A.getStrip(i);
                    for(int j=spntr[i]; j<spntr[i+1]; j++) row[sindx[j]] = svals[j];
                }
                TasBLAS::denseMultiply(num_outputs, num_x, num_points, 1.0, surpluses.getStrip(0), A.getStrip(0), 0.0, y);
            }else{
                Utils::Wrapper2D<double> ywrap(num_outputs, y);
                #pragma omp parallel for
                for(int i=0; i<num_x; i++){
                    double *this_y = ywrap.getStrip(i);
                    std::fill(this_y, this_y + num_outputs, 0.0);
                    for(int j=spntr[i]; j<spntr[i+1]; j++){
                        double v = svals[j];
                        const double *s = surpluses.getStrip(sindx[j]);
                        for(int k=0; k<num_outputs; k++) this_y[k] += v * s[k];
                    }
                }
            }
            break;
        }
        default: {
            evaluateBatchOpenMP(x, num_x, y);
            break;
        }
    }
}